

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<kj::AuthenticatedStream> __thiscall
kj::CapabilityStreamConnectionReceiver::acceptAuthenticated
          (CapabilityStreamConnectionReceiver *this)

{
  _func_int *p_Var1;
  void *pvVar2;
  socklen_t *in_RCX;
  sockaddr *in_RDX;
  int in_ESI;
  TransformPromiseNodeBase *this_00;
  CapabilityStreamConnectionReceiver local_38;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  
  accept(&local_38,in_ESI,in_RDX,in_RCX);
  p_Var1 = local_38.super_ConnectionReceiver._vptr_ConnectionReceiver[1];
  if (p_Var1 == (_func_int *)0x0 ||
      (ulong)((long)local_38.super_ConnectionReceiver._vptr_ConnectionReceiver - (long)p_Var1) <
      0x28) {
    pvVar2 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar2 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_38,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2771:24)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar2 + 0x3d8) = &PTR_destroy_0059b030;
    *(void **)((long)pvVar2 + 0x3e0) = pvVar2;
  }
  else {
    local_38.super_ConnectionReceiver._vptr_ConnectionReceiver[1] = (_func_int *)0x0;
    this_00 = (TransformPromiseNodeBase *)
              (local_38.super_ConnectionReceiver._vptr_ConnectionReceiver + -5);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_38,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2771:24)>
               ::anon_class_1_0_00000001_for_func::operator());
    local_38.super_ConnectionReceiver._vptr_ConnectionReceiver[-5] =
         (_func_int *)&PTR_destroy_0059b030;
    local_38.super_ConnectionReceiver._vptr_ConnectionReceiver[-4] = p_Var1;
  }
  local_38.inner = (AsyncCapabilityStream *)0x0;
  (this->super_ConnectionReceiver)._vptr_ConnectionReceiver = (_func_int **)this_00;
  local_28.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_28);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_38.inner);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_38);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<AuthenticatedStream> CapabilityStreamConnectionReceiver::acceptAuthenticated() {
  return accept().then([](Own<AsyncIoStream>&& stream) {
    return AuthenticatedStream { kj::mv(stream), UnknownPeerIdentity::newInstance() };
  });
}